

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

bool QResource::registerResource(uchar *rccData,QString *resourceRoot)

{
  QAtomicInt *pQVar1;
  bool bVar2;
  QDynamicBufferResourceRoot *this;
  Type *this_00;
  Type *pTVar3;
  ushort *puVar4;
  QDynamicBufferResourceRoot *this_01;
  long in_FS_OFFSET;
  QDeadlineTimer timeout;
  QMessageLogger local_80;
  QString local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_60.d.d = (resourceRoot->d).d;
  local_60.d.ptr = (resourceRoot->d).ptr;
  local_60.d.size = (resourceRoot->d).size;
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_60.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_60.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  qt_resource_fixResourceRoot(&local_48,&local_60);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_48.d.size != (undefined1 *)0x0) {
    if ((&(local_48.d.d)->super_QArrayData == (QArrayData *)0x0) ||
       (1 < ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData(&local_48,local_48.d.size,KeepSize);
    }
    if (*local_48.d.ptr != L'/') {
      local_80.context.version = 2;
      local_80.context._4_8_ = 0;
      local_80.context._12_8_ = 0;
      local_80.context.function._4_4_ = 0;
      local_80.context.category = "default";
      puVar4 = QString::utf16(resourceRoot);
      QMessageLogger::warning
                (&local_80,
                 "QDir::registerResource: Registering a resource [%p] must be rooted in an absolute path (start with /) [%ls]"
                 ,rccData,puVar4);
      bVar2 = false;
      goto LAB_002548c1;
    }
  }
  this = (QDynamicBufferResourceRoot *)operator_new(0x48);
  (this->super_QResourceRoot).payloads = (uchar *)0x0;
  (this->super_QResourceRoot).version = 0;
  (this->super_QResourceRoot).ref = (QAtomicInteger<int>)0x0;
  (this->super_QResourceRoot).tree = (uchar *)0x0;
  (this->super_QResourceRoot).names = (uchar *)0x0;
  (this->super_QResourceRoot)._vptr_QResourceRoot =
       (_func_int **)&PTR__QDynamicBufferResourceRoot_006a8720;
  (this->root).d.d = local_48.d.d;
  (this->root).d.ptr = local_48.d.ptr;
  (this->root).d.size = local_48.d.size;
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->buffer = (uchar *)0x0;
  this_01 = this;
  bVar2 = anon_unknown.dwarf_454c1b::QDynamicBufferResourceRoot::registerSelf(this,rccData,-1);
  if (bVar2) {
    LOCK();
    pQVar1 = &(this->super_QResourceRoot).ref;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
              ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                            *)this_01);
    timeout.t2 = 0;
    timeout.type = 1;
    timeout.t1 = 0x7fffffffffffffff;
    pTVar3 = this_00;
    QRecursiveMutex::tryLock(&this_00->resourceMutex,timeout);
    pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
             ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                           *)pTVar3);
    QList<(anonymous_namespace)::QResourceRoot_*>::append
              (&pTVar3->resourceList,(parameter_type)this);
    QRecursiveMutex::unlock(&this_00->resourceMutex);
  }
  else {
    (*(this->super_QResourceRoot)._vptr_QResourceRoot[1])(this);
  }
LAB_002548c1:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QResource::registerResource(const uchar *rccData, const QString &resourceRoot)
{
    QString r = qt_resource_fixResourceRoot(resourceRoot);
    if (!r.isEmpty() && r[0] != u'/') {
        qWarning("QDir::registerResource: Registering a resource [%p] must be rooted in an "
                 "absolute path (start with /) [%ls]",
                 rccData, qUtf16Printable(resourceRoot));
        return false;
    }

    QDynamicBufferResourceRoot *root = new QDynamicBufferResourceRoot(r);
    if (root->registerSelf(rccData, -1)) {
        root->ref.ref();
        const auto locker = qt_scoped_lock(resourceMutex());
        resourceList()->append(root);
        return true;
    }
    delete root;
    return false;
}